

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclHash.c
# Opt level: O2

Tcl_HashEntry * StringFind(Tcl_HashTable *tablePtr,char *key)

{
  uint uVar1;
  Tcl_HashEntry *pTVar2;
  long lVar3;
  
  uVar1 = HashString(key);
  pTVar2 = (Tcl_HashEntry *)(tablePtr->buckets + (int)(uVar1 & tablePtr->mask));
  do {
    pTVar2 = pTVar2->nextPtr;
    lVar3 = 0x20;
    if (pTVar2 == (Tcl_HashEntry *)0x0) {
      return pTVar2;
    }
    for (; key[lVar3 + -0x20] == *(char *)((long)&pTVar2->nextPtr + lVar3); lVar3 = lVar3 + 1) {
      if (key[lVar3 + -0x20] == '\0') {
        return pTVar2;
      }
    }
  } while( true );
}

Assistant:

static Tcl_HashEntry *
StringFind(Tcl_HashTable *tablePtr, char *key)
{
    register Tcl_HashEntry *hPtr;
    register char *p1, *p2;
    int index;

    index = HashString(key) & tablePtr->mask;

    /* 
     * Search all of the entries in the appropriate bucket.
     */

    for (hPtr = tablePtr->buckets[index]; hPtr != NULL;
	 hPtr = hPtr->nextPtr) {
	for (p1 = key, p2 = hPtr->key.string;; p1++, p2++) {
	    if (*p1 != *p2) {
		break;
	    }
	    if (*p1 == '\0') {
		return hPtr;
	    }
	}
    }
    return NULL;
}